

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ym2612_Emu.cpp
# Opt level: O2

void ym2612_update_chan<2>::func(tables_t *g,channel_t *ch,sample_t_conflict1 *buf,int length)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  ushort uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  undefined1 extraout_XMM0 [16];
  undefined1 auVar19 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar20 [16];
  int local_bc;
  long local_a8;
  short local_98;
  short sStack_96;
  
  if (ch->SLOT[3].Ecnt != 0x20000000) {
    iVar5 = g->LFOinc;
    iVar12 = ch->SLOT[3].Fcnt;
    iVar18 = ch->SLOT[1].Fcnt;
    iVar17 = ch->SLOT[0].Fcnt;
    uVar9 = g->LFOcnt;
    local_a8 = 0;
    uVar14 = ch->SLOT[2].Fcnt;
    iVar6 = ch->S0_OUT[0];
    iVar11 = ch->S0_OUT[1];
    do {
      local_bc = iVar6;
      uVar9 = uVar9 + iVar5;
      uVar10 = (ulong)(uVar9 >> 0x11 & 0x7fe);
      uVar13 = (int)g->ENV_TAB[*(short *)((long)&ch->SLOT[0].Ecnt + 2)] + ch->SLOT[0].TLL;
      iVar8 = (int)*(short *)((long)g->LFO_ENV_TAB + uVar10);
      iVar6 = (iVar8 >> ((byte)ch->SLOT[0].AMS & 0x1f)) + (ch->SLOT[0].env_xor ^ uVar13);
      if (ch->SLOT[0].env_max <= (int)uVar13) {
        iVar6 = 0;
      }
      uVar13 = (int)g->ENV_TAB[*(short *)((long)&ch->SLOT[2].Ecnt + 2)] + ch->SLOT[2].TLL;
      iVar15 = (iVar8 >> ((byte)ch->SLOT[2].AMS & 0x1f)) + (ch->SLOT[2].env_xor ^ uVar13);
      if (ch->SLOT[2].env_max <= (int)uVar13) {
        iVar15 = 0;
      }
      uVar13 = (int)g->ENV_TAB[*(short *)((long)&ch->SLOT[1].Ecnt + 2)] + ch->SLOT[1].TLL;
      iVar7 = (iVar8 >> ((byte)ch->SLOT[1].AMS & 0x1f)) + (ch->SLOT[1].env_xor ^ uVar13);
      if (ch->SLOT[1].env_max <= (int)uVar13) {
        iVar7 = 0;
      }
      uVar13 = (int)g->ENV_TAB[*(short *)((long)&ch->SLOT[3].Ecnt + 2)] + ch->SLOT[3].TLL;
      iVar8 = (iVar8 >> ((byte)ch->SLOT[3].AMS & 0x1f)) + (ch->SLOT[3].env_xor ^ uVar13);
      if (ch->SLOT[3].env_max <= (int)uVar13) {
        iVar8 = 0;
      }
      uVar13 = (iVar11 + local_bc >> ((byte)ch->FB & 0x1f)) + iVar17;
      iVar11 = ((int)*(short *)((long)g->LFO_FREQ_TAB + uVar10) * ch->FMS >> 10) + 0x100;
      uVar16 = ((uint)(ch->SLOT[2].Finc * iVar11) >> 8) + uVar14;
      uVar14 = g->TL_TAB[(long)iVar15 +
                         (long)*(short *)((long)g->SIN_TAB + (ulong)(uVar14 >> 0xd & 0x1ffe))] +
               iVar18;
      iVar15 = local_bc + iVar12;
      iVar17 = ((uint)(ch->SLOT[0].Finc * iVar11) >> 8) + iVar17;
      iVar18 = ((uint)(ch->SLOT[1].Finc * iVar11) >> 8) + iVar18;
      iVar12 = ((uint)(iVar11 * ch->SLOT[3].Finc) >> 8) + iVar12;
      uVar4 = *(ushort *)
               ((long)g->TL_TAB +
               ((long)iVar8 +
               (long)*(short *)((long)g->SIN_TAB +
                               (ulong)((uint)(iVar15 + g->TL_TAB[(long)iVar7 +
                                                                 (long)*(short *)((long)g->SIN_TAB +
                                                                                 (ulong)(uVar14 >> 
                                                  0xd & 0x1ffe))]) >> 0xd & 0x1ffe))) * 4 + 2);
      uVar1 = *(undefined4 *)(buf + local_a8 * 2);
      uVar2 = ch->LEFT;
      uVar3 = ch->RIGHT;
      auVar20._4_4_ = uVar3;
      auVar20._0_4_ = uVar2;
      iVar6 = g->TL_TAB[(long)iVar6 +
                        (long)*(short *)((long)g->SIN_TAB + (ulong)(uVar13 >> 0xd & 0x1ffe))];
      update_envelope(ch->SLOT);
      update_envelope(ch->SLOT + 1);
      update_envelope(ch->SLOT + 2);
      update_envelope(ch->SLOT + 3);
      ch->S0_OUT[0] = iVar6;
      auVar19 = pshuflw(extraout_XMM0,ZEXT216(uVar4),0x40);
      auVar20._8_8_ = 0;
      auVar20 = pshuflw(in_XMM1,auVar20,0xe8);
      auVar20 = auVar20 & auVar19;
      local_98 = (short)uVar1;
      sStack_96 = (short)((uint)uVar1 >> 0x10);
      in_XMM1._0_4_ = CONCAT22(auVar20._2_2_ + sStack_96,auVar20._0_2_ + local_98);
      in_XMM1._4_2_ = auVar20._4_2_;
      in_XMM1._6_2_ = auVar20._6_2_;
      in_XMM1._8_2_ = auVar20._8_2_;
      in_XMM1._10_2_ = auVar20._10_2_;
      in_XMM1._12_2_ = auVar20._12_2_;
      in_XMM1._14_2_ = auVar20._14_2_;
      *(undefined4 *)(buf + local_a8 * 2) = in_XMM1._0_4_;
      local_a8 = local_a8 + 1;
      uVar14 = uVar16;
      iVar11 = local_bc;
    } while (length != (int)local_a8);
    ch->S0_OUT[1] = local_bc;
    ch->SLOT[0].Fcnt = iVar17;
    ch->SLOT[2].Fcnt = uVar16;
    ch->SLOT[1].Fcnt = iVar18;
    ch->SLOT[3].Fcnt = iVar12;
  }
  return;
}

Assistant:

void ym2612_update_chan<algo>::func( tables_t& g, channel_t& ch,
		Ym2612_Emu::sample_t* buf, int length )
{
	int not_end = ch.SLOT [S3].Ecnt - ENV_END;
	
	// algo is a compile-time constant, so all conditions based on it are resolved
	// during compilation
	
	// special cases
	if ( algo == 7 )
		not_end |= ch.SLOT [S0].Ecnt - ENV_END;
	
	if ( algo >= 5 )
		not_end |= ch.SLOT [S2].Ecnt - ENV_END;
	
	if ( algo >= 4 )
		not_end |= ch.SLOT [S1].Ecnt - ENV_END;
	
	int CH_S0_OUT_1 = ch.S0_OUT [1];
	
	int in0 = ch.SLOT [S0].Fcnt;
	int in1 = ch.SLOT [S1].Fcnt;
	int in2 = ch.SLOT [S2].Fcnt;
	int in3 = ch.SLOT [S3].Fcnt;
	
	int YM2612_LFOinc = g.LFOinc;
	int YM2612_LFOcnt = g.LFOcnt + YM2612_LFOinc;
	
	if ( !not_end )
		return;
	
	do
	{
		// envelope
		int const env_LFO = g.LFO_ENV_TAB [YM2612_LFOcnt >> LFO_LBITS & LFO_MASK];
		
		short const* const ENV_TAB = g.ENV_TAB;
		
	#define CALC_EN( x ) \
		int temp##x = ENV_TAB [ch.SLOT [S##x].Ecnt >> ENV_LBITS] + ch.SLOT [S##x].TLL;  \
		int en##x = ((temp##x ^ ch.SLOT [S##x].env_xor) + (env_LFO >> ch.SLOT [S##x].AMS)) &    \
				((temp##x - ch.SLOT [S##x].env_max) >> 31);
		
		CALC_EN( 0 )
		CALC_EN( 1 )
		CALC_EN( 2 )
		CALC_EN( 3 )
		
		int const* const TL_TAB = g.TL_TAB;
		
	#define SINT( i, o ) (TL_TAB [g.SIN_TAB [(i)] + (o)])
		
		// feedback
		int CH_S0_OUT_0 = ch.S0_OUT [0];
		{
			int temp = in0 + ((CH_S0_OUT_0 + CH_S0_OUT_1) >> ch.FB);
			CH_S0_OUT_1 = CH_S0_OUT_0;
			CH_S0_OUT_0 = SINT( (temp >> SIN_LBITS) & SIN_MASK, en0 );
		}
		
		int CH_OUTd;
		if ( algo == 0 )
		{
			int temp = in1 + CH_S0_OUT_1;
			temp = in2 + SINT( (temp >> SIN_LBITS) & SIN_MASK, en1 );
			temp = in3 + SINT( (temp >> SIN_LBITS) & SIN_MASK, en2 );
			CH_OUTd = SINT( (temp >> SIN_LBITS) & SIN_MASK, en3 );
		}
		else if ( algo == 1 )
		{
			int temp = in2 + CH_S0_OUT_1 + SINT( (in1 >> SIN_LBITS) & SIN_MASK, en1 );
			temp = in3 + SINT( (temp >> SIN_LBITS) & SIN_MASK, en2 );
			CH_OUTd = SINT( (temp >> SIN_LBITS) & SIN_MASK, en3 );
		}
		else if ( algo == 2 )
		{
			int temp = in2 + SINT( (in1 >> SIN_LBITS) & SIN_MASK, en1 );
			temp = in3 + CH_S0_OUT_1 + SINT( (temp >> SIN_LBITS) & SIN_MASK, en2 );
			CH_OUTd = SINT( (temp >> SIN_LBITS) & SIN_MASK, en3 );
		}
		else if ( algo == 3 )
		{
			int temp = in1 + CH_S0_OUT_1;
			temp = in3 + SINT( (temp >> SIN_LBITS) & SIN_MASK, en1 ) +
					SINT( (in2 >> SIN_LBITS) & SIN_MASK, en2 );
			CH_OUTd = SINT( (temp >> SIN_LBITS) & SIN_MASK, en3 );
		}
		else if ( algo == 4 )
		{
			int temp = in3 + SINT( (in2 >> SIN_LBITS) & SIN_MASK, en2 );
			CH_OUTd = SINT( (temp >> SIN_LBITS) & SIN_MASK, en3 ) +
					SINT( ((in1 + CH_S0_OUT_1) >> SIN_LBITS) & SIN_MASK, en1 );
			//DO_LIMIT
		}
		else if ( algo == 5 )
		{
			int temp = CH_S0_OUT_1;
			CH_OUTd = SINT( ((in3 + temp) >> SIN_LBITS) & SIN_MASK, en3 ) +
					SINT( ((in1 + temp) >> SIN_LBITS) & SIN_MASK, en1 ) +
					SINT( ((in2 + temp) >> SIN_LBITS) & SIN_MASK, en2 );
			//DO_LIMIT
		}
		else if ( algo == 6 )
		{
			CH_OUTd = SINT( (in3 >> SIN_LBITS) & SIN_MASK, en3 ) +
					SINT( ((in1 + CH_S0_OUT_1) >> SIN_LBITS) & SIN_MASK, en1 ) +
					SINT( (in2 >> SIN_LBITS) & SIN_MASK, en2 );
			//DO_LIMIT
		}
		else if ( algo == 7 )
		{
			CH_OUTd = SINT( (in3 >> SIN_LBITS) & SIN_MASK, en3 ) +
					SINT( (in1 >> SIN_LBITS) & SIN_MASK, en1 ) +
					SINT( (in2 >> SIN_LBITS) & SIN_MASK, en2 ) + CH_S0_OUT_1;
			//DO_LIMIT
		}
		
		CH_OUTd >>= MAX_OUT_BITS - output_bits + 2;
		
		// update phase
		unsigned freq_LFO = ((g.LFO_FREQ_TAB [YM2612_LFOcnt >> LFO_LBITS & LFO_MASK] *
				ch.FMS) >> (LFO_HBITS - 1 + 1)) + (1L << (LFO_FMS_LBITS - 1));
		YM2612_LFOcnt += YM2612_LFOinc;
		in0 += (ch.SLOT [S0].Finc * freq_LFO) >> (LFO_FMS_LBITS - 1);
		in1 += (ch.SLOT [S1].Finc * freq_LFO) >> (LFO_FMS_LBITS - 1);
		in2 += (ch.SLOT [S2].Finc * freq_LFO) >> (LFO_FMS_LBITS - 1);
		in3 += (ch.SLOT [S3].Finc * freq_LFO) >> (LFO_FMS_LBITS - 1);
		
		int t0 = buf [0] + (CH_OUTd & ch.LEFT);
		int t1 = buf [1] + (CH_OUTd & ch.RIGHT);
		
		update_envelope( ch.SLOT [0] );
		update_envelope( ch.SLOT [1] );
		update_envelope( ch.SLOT [2] );
		update_envelope( ch.SLOT [3] );
		
		ch.S0_OUT [0] = CH_S0_OUT_0;
		buf [0] = t0;
		buf [1] = t1;
		buf += 2;
	}
	while ( --length );
	
	ch.S0_OUT [1] = CH_S0_OUT_1;
	
	ch.SLOT [S0].Fcnt = in0;
	ch.SLOT [S1].Fcnt = in1;
	ch.SLOT [S2].Fcnt = in2;
	ch.SLOT [S3].Fcnt = in3;
}